

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.cc
# Opt level: O2

int EVP_PBE_scrypt(char *password,size_t password_len,uint8_t *salt,size_t salt_len,uint64_t N,
                  uint64_t r,uint64_t p,size_t max_mem,uint8_t *out_key,size_t key_len)

{
  block_t *B;
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  block_t *out;
  EVP_MD *pEVar5;
  uint64_t uVar6;
  block_t *__dest;
  uint32_t *out_00;
  block_t *b;
  block_t *out_01;
  uint64_t i_1;
  block_t *pbVar7;
  uint uVar8;
  uint64_t i;
  long lVar9;
  uint64_t uVar10;
  block_t *a;
  bool bVar11;
  int iVar12;
  block_t *local_b0;
  uint local_48;
  
  if (((((p == 0 || r == 0) || (auVar2._8_8_ = 0, auVar2._0_8_ = r, N < 2)) ||
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x3fffffff)) / auVar2,0) < p)) ||
      ((0x100000000 < N ||
       (uVar4 = N - (N >> 1 & 0x5555555555555555),
       uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333),
       1 < (byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))))) ||
     (N >> ((byte)(r << 4) & 0x3f) != 0 && r << 4 < 0x40)) {
    iVar3 = 0x85;
    iVar12 = 0xa1;
  }
  else {
    uVar4 = 0x4100000;
    if (max_mem != 0) {
      uVar4 = max_mem;
    }
    uVar4 = uVar4 / (r * 0x80);
    if ((p < uVar4) && (N <= uVar4 + ~p)) {
      out = (block_t *)OPENSSL_calloc((p * 2 + N * 2 + 2) * r,0x40);
      if (out == (block_t *)0x0) {
        return 0;
      }
      lVar9 = p * 2 * r;
      iVar12 = (int)lVar9 * 0x40;
      pEVar5 = EVP_sha256();
      iVar3 = PKCS5_PBKDF2_HMAC(password,(int)password_len,salt,(int)salt_len,1,pEVar5,iVar12,
                                (uchar *)out);
      if (iVar3 == 0) {
        uVar8 = 0;
      }
      else {
        lVar1 = r * 2;
        B = out + lVar9;
        __dest = B + r * 2;
        local_b0 = out;
        for (uVar6 = 0; uVar6 != p; uVar6 = uVar6 + 1) {
          out_01 = out + uVar6 * lVar1;
          memcpy(__dest,out_01,r * 0x80);
          out_00 = (uint32_t *)((long)out->words + (p * 0x80 + 0x100) * r);
          pbVar7 = __dest;
          for (uVar10 = 1; N != uVar10; uVar10 = uVar10 + 1) {
            scryptBlockMix((block_t *)out_00,pbVar7,r);
            pbVar7 = pbVar7 + r * 2;
            out_00 = out_00 + r * 0x20;
          }
          scryptBlockMix(out_01,__dest + lVar1 * (N - 1),r);
          for (uVar10 = 0; uVar10 != N; uVar10 = uVar10 + 1) {
            local_48 = (uint)(N - 1);
            b = __dest + (ulong)(out_01[r * 2 + -1].words[0] & local_48) * lVar1;
            lVar9 = lVar1;
            pbVar7 = B;
            a = local_b0;
            while (bVar11 = lVar9 != 0, lVar9 = lVar9 + -1, bVar11) {
              xor_block(pbVar7,a,b);
              b = b + 1;
              a = a + 1;
              pbVar7 = pbVar7 + 1;
            }
            scryptBlockMix(out_01,B,r);
          }
          local_b0 = local_b0 + r * 2;
        }
        pEVar5 = EVP_sha256();
        iVar3 = PKCS5_PBKDF2_HMAC(password,(int)password_len,(uchar *)out,iVar12,1,pEVar5,
                                  (int)key_len,out_key);
        uVar8 = (uint)(iVar3 != 0);
      }
      OPENSSL_free(out);
      return uVar8;
    }
    iVar3 = 0x84;
    iVar12 = 0xad;
  }
  ERR_put_error(6,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/scrypt.cc"
                ,iVar12);
  return 0;
}

Assistant:

int EVP_PBE_scrypt(const char *password, size_t password_len,
                   const uint8_t *salt, size_t salt_len, uint64_t N, uint64_t r,
                   uint64_t p, size_t max_mem, uint8_t *out_key,
                   size_t key_len) {
  if (r == 0 || p == 0 || p > SCRYPT_PR_MAX / r ||
      // |N| must be a power of two.
      N < 2 || (N & (N - 1)) ||
      // We only support |N| <= 2^32 in |scryptROMix|.
      N > UINT64_C(1) << 32 ||
      // Check that |N| < 2^(128×r / 8).
      (16 * r <= 63 && N >= UINT64_C(1) << (16 * r))) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PARAMETERS);
    return 0;
  }

  // Determine the amount of memory needed. B, T, and V are |p|, 1, and |N|
  // scrypt blocks, respectively. Each scrypt block is 2*|r| |block_t|s.
  if (max_mem == 0) {
    max_mem = SCRYPT_MAX_MEM;
  }

  size_t max_scrypt_blocks = max_mem / (2 * r * sizeof(block_t));
  if (max_scrypt_blocks < p + 1 || max_scrypt_blocks - p - 1 < N) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_MEMORY_LIMIT_EXCEEDED);
    return 0;
  }

  // Allocate and divide up the scratch space. |max_mem| fits in a size_t, which
  // is no bigger than uint64_t, so none of these operations may overflow.
  static_assert(UINT64_MAX >= SIZE_MAX, "size_t exceeds uint64_t");
  size_t B_blocks = p * 2 * r;
  size_t B_bytes = B_blocks * sizeof(block_t);
  size_t T_blocks = 2 * r;
  size_t V_blocks = N * 2 * r;
  block_t *B = reinterpret_cast<block_t *>(
      OPENSSL_calloc(B_blocks + T_blocks + V_blocks, sizeof(block_t)));
  if (B == NULL) {
    return 0;
  }

  int ret = 0;
  block_t *T = B + B_blocks;
  block_t *V = T + T_blocks;

  // NOTE: PKCS5_PBKDF2_HMAC can only fail due to allocation failure
  // or |iterations| of 0 (we pass 1 here). This is consistent with
  // the documented failure conditions of EVP_PBE_scrypt.
  if (!PKCS5_PBKDF2_HMAC(password, password_len, salt, salt_len, 1,
                         EVP_sha256(), B_bytes, (uint8_t *)B)) {
    goto err;
  }

  for (uint64_t i = 0; i < p; i++) {
    scryptROMix(B + 2 * r * i, r, N, T, V);
  }

  if (!PKCS5_PBKDF2_HMAC(password, password_len, (const uint8_t *)B, B_bytes, 1,
                         EVP_sha256(), key_len, out_key)) {
    goto err;
  }

  ret = 1;

err:
  OPENSSL_free(B);
  return ret;
}